

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.h
# Opt level: O1

bool __thiscall
jrtplib::RTPFakeTransmitter::ShouldAcceptData
          (RTPFakeTransmitter *this,uint32_t srcip,uint16_t srcport)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  ReceiveMode RVar2;
  PortInfo *pPVar3;
  HashElement *pHVar4;
  _List_node_base *p_Var5;
  bool bVar6;
  
  RVar2 = this->receivemode;
  pHVar4 = (this->acceptignoreinfo).table[srcip % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar4;
  if (RVar2 == AcceptSome) {
    bVar6 = false;
    do {
      if (pHVar4 == (HashElement *)0x0) break;
      if (pHVar4->key == srcip) {
        bVar6 = true;
      }
      else {
        pHVar4 = pHVar4->hashnext;
        (this->acceptignoreinfo).curhashelem = pHVar4;
      }
    } while (!bVar6);
    pHVar4 = (this->acceptignoreinfo).curhashelem;
    if (pHVar4 == (HashElement *)0x0) {
      return false;
    }
    pPVar3 = pHVar4->element;
    plVar1 = &pPVar3->portlist;
    p_Var5 = (_List_node_base *)plVar1;
    if (pPVar3->all == false) {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 != (_List_node_base *)plVar1;
        if (p_Var5 == (_List_node_base *)plVar1) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
    else {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 == (_List_node_base *)plVar1;
        if (bVar6) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
  }
  else {
    bVar6 = false;
    do {
      if (pHVar4 == (HashElement *)0x0) break;
      if (pHVar4->key == srcip) {
        bVar6 = true;
      }
      else {
        pHVar4 = pHVar4->hashnext;
        (this->acceptignoreinfo).curhashelem = pHVar4;
      }
    } while (!bVar6);
    pHVar4 = (this->acceptignoreinfo).curhashelem;
    if (pHVar4 == (HashElement *)0x0) {
      return true;
    }
    pPVar3 = pHVar4->element;
    plVar1 = &pPVar3->portlist;
    p_Var5 = (_List_node_base *)plVar1;
    if (pPVar3->all == false) {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 == (_List_node_base *)plVar1;
        if (bVar6) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
    else {
      do {
        p_Var5 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var5->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar6 = p_Var5 != (_List_node_base *)plVar1;
        if (p_Var5 == (_List_node_base *)plVar1) {
          return bVar6;
        }
      } while (*(uint16_t *)&p_Var5[1]._M_next != srcport);
    }
  }
  return bVar6;
}

Assistant:

static int GetIndex(const uint32_t &k)							{ return k%RTPFAKETRANS_HASHSIZE; }